

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O3

sunrealtype N_VWrmsNorm_SensWrapper(N_Vector x,N_Vector w)

{
  long *plVar1;
  long lVar2;
  sunrealtype sVar3;
  double dVar4;
  
  plVar1 = (long *)x->content;
  if ((int)plVar1[1] < 1) {
    sVar3 = 0.0;
  }
  else {
    lVar2 = 0;
    dVar4 = 0.0;
    do {
      sVar3 = N_VWrmsNorm(*(N_Vector *)(*plVar1 + lVar2 * 8),*(N_Vector *)(*w->content + lVar2 * 8))
      ;
      if (sVar3 <= dVar4) {
        sVar3 = dVar4;
      }
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
      dVar4 = sVar3;
    } while (lVar2 < (int)plVar1[1]);
  }
  return sVar3;
}

Assistant:

sunrealtype N_VWrmsNorm_SensWrapper(N_Vector x, N_Vector w)
{
  int i;
  sunrealtype nrm, tmp;

  nrm = ZERO;

  for (i = 0; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VWrmsNorm(NV_VEC_SW(x, i), NV_VEC_SW(w, i));
    if (tmp > nrm) { nrm = tmp; }
  }

  return (nrm);
}